

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O2

RK_S32 DecodeQuantizerDelta(vpBoolCoder_t *bit_ctx)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0xca,
               "DecodeQuantizerDelta");
  }
  RVar1 = vp8hwdDecodeBool128(bit_ctx);
  if (RVar1 == 0) {
    RVar1 = 0;
  }
  else {
    RVar2 = vp8hwdReadBits(bit_ctx,4);
    RVar3 = vp8hwdDecodeBool128(bit_ctx);
    RVar1 = -RVar2;
    if (RVar3 == 0) {
      RVar1 = RVar2;
    }
  }
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0xd1,
               "DecodeQuantizerDelta");
  }
  return RVar1;
}

Assistant:

static RK_S32 DecodeQuantizerDelta(vpBoolCoder_t *bit_ctx)
{
    RK_S32  result = 0;

    FUN_T("FUN_IN");
    if (vp8hwdDecodeBool128(bit_ctx)) {
        result = vp8hwdReadBits(bit_ctx, 4);
        if (vp8hwdDecodeBool128(bit_ctx))
            result = -result;
    }

    FUN_T("FUN_OUT");
    return result;
}